

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

nifti_image * nifti_image_read(char *hname,int read_data)

{
  int iVar1;
  int iVar2;
  char *fname_00;
  znzFile fp_00;
  nifti_image *pnVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  nifti_1_header *pnVar7;
  undefined1 *puVar8;
  byte bVar9;
  nifti_1_header in_stack_fffffffffffffce8;
  znzFile fp;
  char fname [17];
  nifti_1_header nhdr;
  
  bVar9 = 0;
  builtin_strncpy(fname,"nifti_image_read",0x11);
  if (1 < g_opts_0) {
    fprintf(_stderr,"-d image_read from \'%s\', read_data = %d",hname,read_data);
    fwrite(", HAVE_ZLIB = 1\n",0x10,1,_stderr);
  }
  fname_00 = nifti_findhdrname(hname);
  if (fname_00 == (char *)0x0) {
    if (g_opts_0 < 1) {
      return (nifti_image *)0x0;
    }
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",fname,"failed to find header file for",hname);
    return (nifti_image *)0x0;
  }
  if (1 < g_opts_0) {
    fprintf(_stderr,"-d %s: found header filename \'%s\'\n",fname,fname_00);
  }
  iVar1 = nifti_is_gzfile(fname_00);
  if (iVar1 == 0) {
    iVar1 = nifti_get_filesize(fname_00);
  }
  else {
    iVar1 = -1;
  }
  iVar2 = nifti_is_gzfile(fname_00);
  fp_00 = znzopen(fname_00,"rb",iVar2);
  fp = fp_00;
  if (fp_00 == (znzFile)0x0) {
    if (g_opts_0 < 1) goto LAB_0010c341;
    pcVar6 = "failed to open header file";
LAB_0010c2ba:
    fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",fname,pcVar6,fname_00);
  }
  else {
    iVar2 = has_ascii_header(fp_00);
    if (iVar2 < 0) {
      if (0 < g_opts_0) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",fname,"short header read",fname_00);
      }
    }
    else {
      if (iVar2 == 1) {
        pnVar3 = nifti_read_ascii_image(fp_00,fname_00,iVar1,read_data);
        return pnVar3;
      }
      sVar4 = znzread(&nhdr,1,0x15c,fp_00);
      if (0x15b < (int)sVar4) {
        pnVar7 = &nhdr;
        puVar8 = &stack0xfffffffffffffce8;
        for (lVar5 = 0x15c; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar8 = (char)pnVar7->sizeof_hdr;
          pnVar7 = (nifti_1_header *)((long)pnVar7 + (ulong)bVar9 * -2 + 1);
          puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
        }
        pnVar3 = nifti_convert_nhdr2nim(in_stack_fffffffffffffce8,fname_00);
        if (pnVar3 != (nifti_image *)0x0) {
          if ((3 < g_opts_0) &&
             (fwrite("+d nifti_image_read(), have nifti image:\n",0x29,1,_stderr), 2 < g_opts_0)) {
            nifti_image_infodump(pnVar3);
          }
          if (nhdr.magic[1] == '+') {
            iVar1 = pnVar3->iname_offset;
          }
          nifti_read_extensions(pnVar3,fp,iVar1 + -0x15c);
          Xznzclose(&fp);
          free(fname_00);
          if (read_data != 0) {
            iVar1 = nifti_image_load(pnVar3);
            if (iVar1 < 0) {
              nifti_image_free(pnVar3);
              return (nifti_image *)0x0;
            }
            return pnVar3;
          }
          pnVar3->data = (void *)0x0;
          return pnVar3;
        }
        Xznzclose(&fp);
        if (g_opts_0 < 1) goto LAB_0010c341;
        pcVar6 = "cannot create nifti image from header";
        goto LAB_0010c2ba;
      }
      if (0 < g_opts_0) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",fname,"bad binary header read for file",
                fname_00);
        fprintf(_stderr,"  - read %d of %d bytes\n",sVar4 & 0xffffffff,0x15c);
      }
    }
    Xznzclose(&fp);
  }
LAB_0010c341:
  free(fname_00);
  return (nifti_image *)0x0;
}

Assistant:

nifti_image *nifti_image_read( const char *hname , int read_data )
{
   struct nifti_1_header  nhdr ;
   nifti_image           *nim ;
   znzFile                fp ;
   int                    rv, ii , filesize, remaining;
   char                   fname[] = { "nifti_image_read" };
   char                  *hfile=NULL;

   if( g_opts.debug > 1 ){
      fprintf(stderr,"-d image_read from '%s', read_data = %d",hname,read_data);
#ifdef HAVE_ZLIB
      fprintf(stderr,", HAVE_ZLIB = 1\n");
#else
      fprintf(stderr,", HAVE_ZLIB = 0\n");
#endif
   }

   /**- determine filename to use for header */
   hfile = nifti_findhdrname(hname);
   if( hfile == NULL ){
      if(g_opts.debug > 0)
         LNI_FERR(fname,"failed to find header file for", hname);
      return NULL;  /* check return */
   } else if( g_opts.debug > 1 )
      fprintf(stderr,"-d %s: found header filename '%s'\n",fname,hfile);

   if( nifti_is_gzfile(hfile) ) filesize = -1;  /* unknown */
   else                         filesize = nifti_get_filesize(hfile);

   fp = znzopen(hfile, "rb", nifti_is_gzfile(hfile));
   if( znz_isnull(fp) ){
      if( g_opts.debug > 0 ) LNI_FERR(fname,"failed to open header file",hfile);
      free(hfile);
      return NULL;
   }

   rv = has_ascii_header( fp );
   if( rv < 0 ){
      if( g_opts.debug > 0 ) LNI_FERR(fname,"short header read",hfile);
      znzclose( fp );
      free(hfile);
      return NULL;
   }
   else if ( rv == 1 )  /* process special file type */
      return nifti_read_ascii_image( fp, hfile, filesize, read_data );

   /* else, just process normally */

   /**- read binary header */

   ii = (int)znzread( &nhdr , 1 , sizeof(nhdr) , fp ) ;       /* read the thing */

   /* keep file open so we can check for exts. after nifti_convert_nhdr2nim() */

   if( ii < (int) sizeof(nhdr) ){
      if( g_opts.debug > 0 ){
         LNI_FERR(fname,"bad binary header read for file", hfile);
         fprintf(stderr,"  - read %d of %d bytes\n",ii, (int)sizeof(nhdr));
      }
      znzclose(fp) ;
      free(hfile);
      return NULL;
   }

   /* create output image struct and set it up */

   /**- convert all nhdr fields to nifti_image fields */
   nim = nifti_convert_nhdr2nim(nhdr,hfile);

   if( nim == NULL ){
      znzclose( fp ) ;                                   /* close the file */
      if( g_opts.debug > 0 )
         LNI_FERR(fname,"cannot create nifti image from header",hfile);
      free(hfile); /* had to save this for debug message */
      return NULL;
   }

   if( g_opts.debug > 3 ){
      fprintf(stderr,"+d nifti_image_read(), have nifti image:\n");
      if( g_opts.debug > 2 ) nifti_image_infodump(nim);
   }

   /**- check for extensions (any errors here means no extensions) */
   if( NIFTI_ONEFILE(nhdr) ) remaining = nim->iname_offset - sizeof(nhdr);
   else                      remaining = filesize - sizeof(nhdr);

   (void)nifti_read_extensions(nim, fp, remaining);

   znzclose( fp ) ;                                      /* close the file */
   free(hfile);

   /**- read the data if desired, then bug out */
   if( read_data ){
      if( nifti_image_load( nim ) < 0 ){
         nifti_image_free(nim);          /* take ball, go home. */
         return NULL;
      }
   }
   else nim->data = NULL ;

   return nim ;
}